

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_stswi(DisasContext_conflict10 *ctx)

{
  ushort uVar1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uintptr_t o_5;
  TCGTemp *pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o_1;
  TCGv_i64 pTVar5;
  TCGContext_conflict10 *tcg_ctx;
  uint uVar6;
  TCGOpcode opc;
  uint val;
  uintptr_t o_4;
  uintptr_t o;
  TCGv_i64 ret;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  uVar6 = ctx->opcode;
  if (ctx->le_mode == true) {
    gen_exception_err(ctx,5,uVar6 & 0x3ff0000 | 3);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x20
                     );
    ctx->access_type = 0x20;
  }
  uVar6 = uVar6 >> 0xb & 0x1f;
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = *(ushort *)((long)&ctx->opcode + 2);
  if ((uVar1 & 0x1f) == 0) {
    opc = INDEX_op_movi_i64;
    pTVar5 = (TCGv_i64)0x0;
  }
  else {
    pTVar5 = cpu_gpr[(ulong)uVar1 & 0x1f];
    if (ctx->sf_mode == false) {
      tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,pTVar5);
      goto LAB_00b942c0;
    }
    if (pTVar5 == ret) goto LAB_00b942c0;
    pTVar5 = pTVar5 + (long)tcg_ctx_01;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_ppc64(tcg_ctx_01,opc,(TCGArg)((long)tcg_ctx_01 + (long)ret),(TCGArg)pTVar5);
LAB_00b942c0:
  val = 0x20;
  if (uVar6 != 0) {
    val = uVar6;
  }
  pTVar3 = tcg_const_i32_ppc64(tcg_ctx_00,val);
  pTVar4 = tcg_const_i32_ppc64(tcg_ctx_00,ctx->opcode >> 0x15 & 0x1f);
  local_48 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
  local_40 = (TCGTemp *)(ret + (long)tcg_ctx_00);
  local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx_00);
  local_30 = (TCGTemp *)(pTVar4 + (long)tcg_ctx_00);
  tcg_gen_callN_ppc64(tcg_ctx_00,helper_stsw_ppc64,(TCGTemp *)0x0,4,&local_48);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar3 + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(pTVar4 + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_stswi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv_i32 t1, t2;
    int nb = NB(ctx->opcode);

    if (ctx->le_mode) {
        gen_align_no_le(ctx);
        return;
    }
    gen_set_access_type(ctx, ACCESS_INT);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_register(ctx, t0);
    if (nb == 0) {
        nb = 32;
    }
    t1 = tcg_const_i32(tcg_ctx, nb);
    t2 = tcg_const_i32(tcg_ctx, rS(ctx->opcode));
    gen_helper_stsw(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}